

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> * __thiscall
S2Builder::SortInputVertices
          (vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
           *__return_storage_ptr__,S2Builder *this)

{
  pointer *pppVar1;
  iterator __position;
  __normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
  __first;
  __normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
  __last;
  ulong uVar2;
  long lVar3;
  pointer pVVar4;
  ulong uVar5;
  __normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
  __i;
  __normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
  __last_00;
  pair<S2CellId,_int> local_48;
  S2CellId local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pVVar4 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      S2CellId::S2CellId(&local_38,(S2Point *)((long)pVVar4->c_ + lVar3));
      local_48.first.id_ = local_38.id_;
      local_48.second = (int)uVar5;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>>::
        _M_realloc_insert<std::pair<S2CellId,int>>
                  ((vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>> *)
                   __return_storage_ptr__,__position,&local_48);
      }
      else {
        (__position._M_current)->second = local_48.second;
        ((__position._M_current)->first).id_ = local_38.id_;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      pVVar4 = (this->input_vertices_).
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->input_vertices_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar4 >> 3) * -0x5555555555555555;
      lVar3 = lVar3 + 0x18;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  __first._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar5 = ((long)__last._M_current - (long)__first._M_current >> 2) * -0x5555555555555555;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<S2CellId,int>*,std::vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortInputVertices()::__0>>
              (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:599:13)>
                )this);
    if ((long)__last._M_current - (long)__first._M_current < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<S2CellId,int>*,std::vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortInputVertices()::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:599:13)>
                  )this);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<S2CellId,int>*,std::vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::SortInputVertices()::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:599:13)>
                  )this);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<S2CellId,int>*,std::vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::SortInputVertices()::__0>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:599:13)>
                    )this);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Builder::InputVertexKey> S2Builder::SortInputVertices() {
  // Sort all the input vertices in the order that we wish to consider them as
  // candidate Voronoi sites.  Any sort order will produce correct output, so
  // we have complete flexibility in choosing the sort key.  We could even
  // leave them unsorted, although this would have the disadvantage that
  // changing the order of the input edges could cause S2Builder to snap to a
  // different set of Voronoi sites.
  //
  // We have chosen to sort them primarily by S2CellId since this improves the
  // performance of many S2Builder phases (due to better spatial locality).
  // It also allows the possibility of replacing the current S2PointIndex
  // approach with a more efficient recursive divide-and-conquer algorithm.
  //
  // However, sorting by leaf S2CellId alone has two small disadvantages in
  // the case where the candidate sites are densely spaced relative to the
  // snap radius (e.g., when using the IdentitySnapFunction, or when snapping
  // to E6/E7 near the poles, or snapping to S2CellId/E6/E7 using a snap
  // radius larger than the minimum value required):
  //
  //  - First, it tends to bias the Voronoi site locations towards points that
  //    are earlier on the S2CellId Hilbert curve.  For example, suppose that
  //    there are two parallel rows of input vertices on opposite sides of the
  //    edge between two large S2Cells, and the rows are separated by less
  //    than the snap radius.  Then only vertices from the cell with the
  //    smaller S2CellId are selected, because they are considered first and
  //    prevent us from selecting the sites from the other cell (because they
  //    are closer than "snap_radius" to an existing site).
  //
  //  - Second, it tends to choose more Voronoi sites than necessary, because
  //    at each step we choose the first site along the Hilbert curve that is
  //    at least "snap_radius" away from all previously selected sites.  This
  //    tends to yield sites whose "coverage discs" overlap quite a bit,
  //    whereas it would be better to cover all the input vertices with a
  //    smaller set of coverage discs that don't overlap as much.  (This is
  //    the "geometric set cover problem", which is NP-hard.)
  //
  // It is not worth going to much trouble to fix these problems, because they
  // really aren't that important (and don't affect the guarantees made by the
  // algorithm), but here are a couple of heuristics that might help:
  //
  // 1. Sort the input vertices by S2CellId at a coarse level (down to cells
  // that are O(snap_radius) in size), and then sort by a fingerprint of the
  // S2Point coordinates (i.e., quasi-randomly).  This would retain most of
  // the advantages of S2CellId sorting, but makes it more likely that we will
  // select sites that are further apart.
  //
  // 2. Rather than choosing the first uncovered input vertex and snapping it
  // to obtain the next Voronoi site, instead look ahead through following
  // candidates in S2CellId order and choose the furthest candidate whose
  // snapped location covers all previous uncovered input vertices.
  //
  // TODO(ericv): Experiment with these approaches.

  vector<InputVertexKey> keys;
  keys.reserve(input_vertices_.size());
  for (InputVertexId i = 0; i < input_vertices_.size(); ++i) {
    keys.push_back(InputVertexKey(S2CellId(input_vertices_[i]), i));
  }
  std::sort(keys.begin(), keys.end(),
            [this](const InputVertexKey& a, const InputVertexKey& b) {
      if (a.first < b.first) return true;
      if (b.first < a.first) return false;
      return input_vertices_[a.second] < input_vertices_[b.second];
    });
  return keys;
}